

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::CModuleBuilder::SetExternal
          (CModuleBuilder *this,CToken *nameToken,CToken *externalNameToken)

{
  bool bVar1;
  CPreparatoryFunction *function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = addFunction(this,nameToken);
    bVar1 = checkOnlyDeclared(this,function,nameToken);
    if (bVar1) {
      if (function->entry == false) {
        CPreparatoryFunction::SetDefined(function,nameToken);
        CPreparatoryFunction::SetExternal(function,externalNameToken);
        return;
      }
      std::operator+(&local_40,"function `",&nameToken->word);
      std::operator+(&local_60,&local_40,"` already defined as entry");
      error(this,nameToken,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetExternal( const CToken& nameToken,
	const CToken& externalNameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		if( !function.IsEntry() ) {
			function.SetDefined( nameToken );
			function.SetExternal( externalNameToken );
		} else {
			error( nameToken, "function `" + nameToken.word +
				"` already defined as entry" );
		}
	}
}